

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnObj.c
# Opt level: O0

void Wln_ObjUpdateType(Wln_Ntk_t *p,int iObj,int Type)

{
  int iVar1;
  int Type_local;
  int iObj_local;
  Wln_Ntk_t *p_local;
  
  iVar1 = Wln_ObjIsNone(p,iObj);
  if (iVar1 != 0) {
    iVar1 = Wln_ObjType(p,iObj);
    p->nObjs[iVar1] = p->nObjs[iVar1] + -1;
    Vec_IntWriteEntry(&p->vTypes,iObj,Type);
    iVar1 = Wln_ObjType(p,iObj);
    p->nObjs[iVar1] = p->nObjs[iVar1] + 1;
    return;
  }
  __assert_fail("Wln_ObjIsNone(p, iObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnObj.c"
                ,0x3c,"void Wln_ObjUpdateType(Wln_Ntk_t *, int, int)");
}

Assistant:

void Wln_ObjUpdateType( Wln_Ntk_t * p, int iObj, int Type )
{
    assert( Wln_ObjIsNone(p, iObj) );
    p->nObjs[Wln_ObjType(p, iObj)]--;
    Vec_IntWriteEntry( &p->vTypes, iObj, Type );
    p->nObjs[Wln_ObjType(p, iObj)]++;
}